

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash2.cpp
# Opt level: O1

uint32_t MurmurHash2A(void *key,int len,uint32_t seed)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint32_t h;
  uint32_t l;
  
  iVar2 = len;
  iVar4 = len;
  if (3 < len) {
    do {
      seed = seed * 0x5bd1e995 ^
             ((uint)(*key * 0x5bd1e995) >> 0x18 ^ *key * 0x5bd1e995) * 0x5bd1e995;
      key = (void *)((long)key + 4);
      iVar4 = iVar2 + -4;
      bVar1 = 7 < iVar2;
      iVar2 = iVar4;
    } while (bVar1);
  }
  uVar3 = 0;
  if (iVar4 != 1) {
    if (iVar4 != 2) {
      if (iVar4 != 3) goto LAB_001669c8;
      uVar3 = (uint)*(byte *)((long)key + 2) << 0x10;
    }
    uVar3 = uVar3 | (uint)*(byte *)((long)key + 1) << 8;
  }
  uVar3 = (*key ^ uVar3) * 0x5bd1e995;
LAB_001669c8:
  uVar3 = (seed * 0x5bd1e995 ^ (uVar3 >> 0x18 ^ uVar3) * 0x5bd1e995) * 0x5bd1e995 ^
          ((uint)(len * 0x5bd1e995) >> 0x18 ^ len * 0x5bd1e995) * 0x5bd1e995;
  uVar3 = (uVar3 >> 0xd ^ uVar3) * 0x5bd1e995;
  return uVar3 >> 0xf ^ uVar3;
}

Assistant:

uint32_t MurmurHash2A ( const void * key, int len, uint32_t seed )
{
  const uint32_t m = 0x5bd1e995;
  const int r = 24;
  uint32_t l = len;

  const unsigned char * data = (const unsigned char *)key;

  uint32_t h = seed;

  while(len >= 4)
  {
    uint32_t k = *(uint32_t*)data;

    mmix(h,k);

    data += 4;
    len -= 4;
  }

  uint32_t t = 0;

  switch(len)
  {
  case 3: t ^= data[2] << 16;
  case 2: t ^= data[1] << 8;
  case 1: t ^= data[0];
  };

  mmix(h,t);
  mmix(h,l);

  h ^= h >> 13;
  h *= m;
  h ^= h >> 15;

  return h;
}